

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

int ov_pcm_seek(OggVorbis_File *vf,ogg_int64_t pos)

{
  ogg_stream_state *os;
  vorbis_dsp_state *v;
  vorbis_block *vb;
  int iVar1;
  int iVar2;
  long lVar3;
  ogg_int64_t oVar4;
  byte bVar5;
  int readp;
  long lVar6;
  long lVar7;
  ogg_packet op;
  ogg_page og;
  long local_a0;
  ogg_packet local_80;
  ogg_page local_50;
  
  iVar1 = ov_pcm_seek_page(vf,pos);
  if ((iVar1 < 0) || (iVar1 = _make_decode_ready(vf), iVar1 != 0)) {
    return iVar1;
  }
  os = &vf->os;
  v = &vf->vd;
  vb = &vf->vb;
  local_a0 = 0;
LAB_001a85fd:
  do {
    while( true ) {
      iVar1 = ogg_stream_packetpeek(os,&local_80);
      if (iVar1 < 1) break;
      lVar3 = vorbis_packet_blocksize(vf->vi + vf->current_link,&local_80);
      iVar1 = (int)lVar3;
      if (iVar1 < 0) {
        ogg_stream_packetout(os,(ogg_packet *)0x0);
      }
      else {
        lVar6 = vf->pcm_offset;
        if ((int)local_a0 != 0) {
          lVar6 = lVar6 + (ulong)((uint)((int)local_a0 + iVar1) >> 2);
          vf->pcm_offset = lVar6;
        }
        iVar2 = vorbis_info_blocksize(vf->vi,1);
        if (pos <= (iVar2 + iVar1 >> 2) + lVar6) {
LAB_001a87f5:
          vf->bittrack = 0.0;
          vf->samptrack = 0.0;
          iVar1 = vorbis_synthesis_halfrate_p(vf->vi);
          bVar5 = (byte)iVar1;
          lVar3 = vf->pcm_offset;
          while (lVar3 < (long)(((ulong)pos >> (bVar5 & 0x3f)) << (bVar5 & 0x3f))) {
            lVar6 = pos - lVar3 >> (bVar5 & 0x3f);
            iVar2 = vorbis_synthesis_pcmout(v,(float ***)0x0);
            lVar7 = (long)iVar2;
            lVar3 = lVar7;
            if (lVar6 < lVar7) {
              lVar3 = lVar6;
            }
            vorbis_synthesis_read(v,(int)lVar3);
            lVar3 = (lVar3 << (bVar5 & 0x3f)) + vf->pcm_offset;
            vf->pcm_offset = lVar3;
            if (lVar7 < lVar6) {
              iVar2 = _fetch_and_process_packet(vf,(ogg_packet *)0x1,readp,iVar1);
              if (iVar2 < 1) {
                lVar3 = ov_pcm_total(vf,-1);
                vf->pcm_offset = lVar3;
              }
              else {
                lVar3 = vf->pcm_offset;
              }
            }
          }
          return 0;
        }
        ogg_stream_packetout(os,(ogg_packet *)0x0);
        vorbis_synthesis_trackonly(vb,&local_80);
        vorbis_synthesis_blockin(v,vb);
        local_a0 = lVar3;
        if (-1 < local_80.granulepos) {
          lVar6 = (long)vf->current_link;
          lVar3 = local_80.granulepos - vf->pcmlengths[lVar6 * 2];
          if (lVar3 < 1) {
            lVar3 = 0;
          }
          vf->pcm_offset = lVar3;
          if (0 < lVar6) {
            lVar7 = 0;
            do {
              lVar3 = lVar3 + *(long *)((long)vf->pcmlengths + lVar7 + 8);
              vf->pcm_offset = lVar3;
              lVar7 = lVar7 + 0x10;
            } while (lVar6 * 0x10 != lVar7);
          }
        }
      }
    }
    if (((iVar1 != 0) && (iVar1 != -3)) || (oVar4 = _get_next_page(vf,&local_50,-1), oVar4 < 0))
    goto LAB_001a87f5;
    iVar1 = ogg_page_bos(&local_50);
    if (iVar1 == 0) {
      if (vf->ready_state < 3) goto LAB_001a8766;
      goto LAB_001a87e5;
    }
    vorbis_dsp_clear(v);
    vorbis_block_clear(vb);
    vf->ready_state = 2;
LAB_001a8766:
    iVar2 = ogg_page_serialno(&local_50);
    iVar1 = vf->links;
    if ((long)iVar1 < 1) break;
    lVar3 = 0;
    do {
      if (vf->serialnos[lVar3] == (long)iVar2) goto LAB_001a8797;
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  } while( true );
  lVar3 = 0;
LAB_001a8797:
  if ((int)lVar3 != iVar1) {
    vf->current_link = (int)lVar3;
    vf->ready_state = 3;
    iVar1 = ogg_page_serialno(&local_50);
    vf->current_serialno = (long)iVar1;
    ogg_stream_reset_serialno(os,iVar2);
    iVar1 = _make_decode_ready(vf);
    local_a0 = 0;
    if (iVar1 != 0) {
      return iVar1;
    }
LAB_001a87e5:
    ogg_stream_pagein(os,&local_50);
  }
  goto LAB_001a85fd;
}

Assistant:

int ov_pcm_seek(OggVorbis_File *vf,ogg_int64_t pos){
  int thisblock,lastblock=0;
  int ret=ov_pcm_seek_page(vf,pos);
  if(ret<0)return(ret);
  if((ret=_make_decode_ready(vf)))return ret;

  /* discard leading packets we don't need for the lapping of the
     position we want; don't decode them */

  while(1){
    ogg_packet op;
    ogg_page og;

    int ret=ogg_stream_packetpeek(&vf->os,&op);
    if(ret>0){
      thisblock=vorbis_packet_blocksize(vf->vi+vf->current_link,&op);
      if(thisblock<0){
        ogg_stream_packetout(&vf->os,NULL);
        continue; /* non audio packet */
      }
      if(lastblock)vf->pcm_offset+=(lastblock+thisblock)>>2;

      if(vf->pcm_offset+((thisblock+
                          vorbis_info_blocksize(vf->vi,1))>>2)>=pos)break;

      /* remove the packet from packet queue and track its granulepos */
      ogg_stream_packetout(&vf->os,NULL);
      vorbis_synthesis_trackonly(&vf->vb,&op);  /* set up a vb with
                                                   only tracking, no
                                                   pcm_decode */
      vorbis_synthesis_blockin(&vf->vd,&vf->vb);

      /* end of logical stream case is hard, especially with exact
         length positioning. */

      if(op.granulepos>-1){
        int i;
        /* always believe the stream markers */
        vf->pcm_offset=op.granulepos-vf->pcmlengths[vf->current_link*2];
        if(vf->pcm_offset<0)vf->pcm_offset=0;
        for(i=0;i<vf->current_link;i++)
          vf->pcm_offset+=vf->pcmlengths[i*2+1];
      }

      lastblock=thisblock;

    }else{
      if(ret<0 && ret!=OV_HOLE)break;

      /* suck in a new page */
      if(_get_next_page(vf,&og,-1)<0)break;
      if(ogg_page_bos(&og))_decode_clear(vf);

      if(vf->ready_state<STREAMSET){
        long serialno=ogg_page_serialno(&og);
        int link;

        for(link=0;link<vf->links;link++)
          if(vf->serialnos[link]==serialno)break;
        if(link==vf->links) continue;
        vf->current_link=link;

        vf->ready_state=STREAMSET;
        vf->current_serialno=ogg_page_serialno(&og);
        ogg_stream_reset_serialno(&vf->os,serialno);
        ret=_make_decode_ready(vf);
        if(ret)return ret;
        lastblock=0;
      }

      ogg_stream_pagein(&vf->os,&og);
    }
  }

  vf->bittrack=0.f;
  vf->samptrack=0.f;
  /* discard samples until we reach the desired position. Crossing a
     logical bitstream boundary with abandon is OK. */
  {
    /* note that halfrate could be set differently in each link, but
       vorbisfile encoforces all links are set or unset */
    int hs=vorbis_synthesis_halfrate_p(vf->vi);
    while(vf->pcm_offset<((pos>>hs)<<hs)){
      ogg_int64_t target=(pos-vf->pcm_offset)>>hs;
      long samples=vorbis_synthesis_pcmout(&vf->vd,NULL);

      if(samples>target)samples=target;
      vorbis_synthesis_read(&vf->vd,samples);
      vf->pcm_offset+=samples<<hs;

      if(samples<target)
        if(_fetch_and_process_packet(vf,NULL,1,1)<=0)
          vf->pcm_offset=ov_pcm_total(vf,-1); /* eof */
    }
  }
  return 0;
}